

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_6d54c::DirectoryTreeSignatureTask::provideValue
          (DirectoryTreeSignatureTask *this,TaskInterface ti,uintptr_t inputID,KeyType *key,
          ValueType *valueData)

{
  pointer *ppSVar1;
  char *pcVar2;
  uint64_t uVar3;
  Twine *pTVar4;
  Child *pCVar5;
  Child *pCVar6;
  Child CVar7;
  Child CVar8;
  Child CVar9;
  Child *pCVar10;
  pointer pSVar11;
  Child *pCVar12;
  bool bVar13;
  ulong uVar14;
  FileInfo *this_00;
  pointer pSVar15;
  undefined8 *puVar16;
  uintptr_t uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  StringRef name;
  StringRef str;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> filenames;
  BuildValue value;
  SmallString<256U> childPath;
  Child local_290;
  Child local_288;
  undefined1 local_280;
  undefined7 uStack_27f;
  Child CStack_278;
  Twine *local_270;
  Twine *pTStack_268;
  Twine *local_260;
  Twine *local_258;
  Child CStack_250;
  Twine *local_248;
  char local_240;
  DirectoryTreeSignatureTask *local_238;
  uintptr_t local_230;
  Child local_228;
  long local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  Child local_208;
  Twine *local_200;
  long local_1f8;
  TaskInterface local_1f0;
  Twine local_1e0;
  BuildValue local_1c8;
  BinaryDecoder local_158 [11];
  Twine local_48;
  
  local_1f0.ctx = ti.ctx;
  local_1f0.impl = ti.impl;
  if (inputID == 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->directoryValue,valueData);
    local_158[0].data.Data =
         (char *)(valueData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
    local_158[0].data.Length =
         (long)(valueData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_finish - (long)local_158[0].data.Data;
    local_158[0].pos = 0;
    llbuild::buildsystem::BuildValue::BuildValue(&local_1c8,local_158);
    uVar3 = (this->filters).size;
    if (((uVar3 != 0) || (local_1c8.kind == DirectoryContents)) &&
       ((uVar3 == 0 || (local_1c8.kind == FilteredDirectoryContents)))) {
      if ((local_1c8.kind != DirectoryContents) && (local_1c8.kind != FilteredDirectoryContents)) {
        __assert_fail("value.isFilteredDirectoryContents() || value.isDirectoryContents()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp"
                      ,0x515,
                      "virtual void (anonymous namespace)::DirectoryTreeSignatureTask::provideValue(TaskInterface, uintptr_t, const KeyType &, const ValueType &)"
                     );
      }
      llbuild::buildsystem::BuildValue::getDirectoryContents
                ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&local_208,&local_1c8)
      ;
      if (local_200 != local_208.twine) {
        uVar17 = 0;
        local_238 = this;
        do {
          local_158[0].data.Data = (char *)&local_158[0].pos;
          pcVar2 = (this->path)._M_dataplus._M_p;
          local_158[0].data.Length._0_4_ = 0;
          local_158[0].data.Length._4_4_ = 0x100;
          llvm::SmallVectorImpl<char>::append<char_const*,void>
                    ((SmallVectorImpl<char> *)local_158,pcVar2,
                     pcVar2 + (this->path)._M_string_length);
          local_230 = uVar17;
          llvm::Twine::Twine((Twine *)&local_290,(StringRef *)(&(local_208.twine)->LHS + uVar17 * 2)
                            );
          llvm::Twine::Twine((Twine *)&local_228,"");
          llvm::Twine::Twine(&local_1e0,"");
          llvm::Twine::Twine(&local_48,"");
          llvm::sys::path::append
                    ((SmallVectorImpl<char> *)local_158,(Twine *)&local_290,(Twine *)&local_228,
                     &local_1e0,&local_48);
          pTVar4 = (&(local_208.twine)->LHS)[uVar17 * 2].twine;
          if (pTVar4 == (Twine *)0x0) {
            local_290.twine = (Twine *)&local_280;
            local_288.twine = (Twine *)0x0;
            local_280 = 0;
          }
          else {
            local_290.twine = (Twine *)&local_280;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_290,pTVar4,
                       (long)&pTVar4->LHS + (long)(&(local_208.twine)->RHS)[uVar17 * 2].twine);
          }
          local_240 = '\0';
          local_270 = (Twine *)0x0;
          pTStack_268 = (Twine *)0x0;
          local_260 = (Twine *)0x0;
          pCVar5 = (Child *)(local_238->childResults).
                            super__Vector_base<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
          if (pCVar5 == (Child *)(local_238->childResults).
                                 super__Vector_base<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            pCVar6 = (Child *)(local_238->childResults).
                              super__Vector_base<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start;
            if ((long)pCVar5 - (long)pCVar6 == 0x7ffffffffffffff8) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            lVar18 = (long)pCVar5 - (long)pCVar6 >> 3;
            uVar19 = lVar18 * 0x2e8ba2e8ba2e8ba3;
            uVar14 = uVar19;
            if (pCVar5 == pCVar6) {
              uVar14 = 1;
            }
            uVar20 = uVar14 + uVar19;
            if (0x1745d1745d1745c < uVar20) {
              uVar20 = 0x1745d1745d1745d;
            }
            if (CARRY8(uVar14,uVar19)) {
              uVar20 = 0x1745d1745d1745d;
            }
            if (uVar20 == 0) {
              pSVar15 = (pointer)0x0;
            }
            else {
              pSVar15 = (pointer)operator_new(uVar20 * 0x58);
            }
            lVar18 = lVar18 * 8;
            pCVar12 = (Child *)((long)&(pSVar15->directorySignatureValue).Storage.storage +
                               lVar18 + -0x38);
            puVar16 = (undefined8 *)
                      ((long)&(pSVar15->directorySignatureValue).Storage.storage + lVar18 + -0x38);
            *puVar16 = puVar16 + 2;
            if (local_290.twine == (Twine *)&local_280) {
              puVar16[2] = CONCAT71(uStack_27f,local_280);
              *(Child *)(puVar16 + 3) = CStack_278;
            }
            else {
              pCVar12->twine = (Twine *)local_290;
              CVar9._1_7_ = uStack_27f;
              CVar9.character = local_280;
              pCVar12[2] = CVar9;
            }
            pCVar12[1] = local_288;
            local_288.twine = (Twine *)0x0;
            local_280 = 0;
            pCVar12[4].twine = local_270;
            pCVar12[5].twine = pTStack_268;
            pCVar12[6].twine = local_260;
            local_260 = (Twine *)0x0;
            local_270 = (Twine *)0x0;
            pTStack_268 = (Twine *)0x0;
            pCVar12[10].character = local_240;
            pCVar10 = pCVar6;
            local_290.twine = (Twine *)&local_280;
            pSVar11 = pSVar15;
            if (local_240 == '\x01') {
              pCVar12[7].twine = local_258;
              pCVar12[8] = CStack_250;
              pCVar12[9].twine = local_248;
              local_258 = (Twine *)0x0;
              CStack_250.twine = (Twine *)0x0;
              local_248 = (Twine *)0x0;
            }
            for (; pCVar12 = pCVar6, this = local_238, pCVar5 != pCVar10; pCVar10 = pCVar10 + 0xb) {
              (pSVar11->filename)._M_dataplus._M_p = (pointer)&(pSVar11->filename).field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)pSVar11,pCVar10->twine,
                         (long)&pCVar10->twine->LHS + (long)&(pCVar10[1].twine)->LHS);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        (&pSVar11->value,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(pCVar10 + 4));
              llvm::optional_detail::
              OptionalStorage<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>::
              OptionalStorage(&(pSVar11->directorySignatureValue).Storage,
                              (OptionalStorage<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>
                               *)(pCVar10 + 7));
              pSVar11 = pSVar11 + 1;
            }
            for (; local_238 = this, pCVar5 != pCVar12; pCVar12 = pCVar12 + 0xb) {
              if ((bool)pCVar12[10].character == true) {
                pTVar4 = pCVar12[7].twine;
                if (pTVar4 != (Twine *)0x0) {
                  operator_delete(pTVar4,(long)pCVar12[9].twine - (long)pTVar4);
                }
                pCVar12[10].character = false;
              }
              pTVar4 = pCVar12[4].twine;
              if (pTVar4 != (Twine *)0x0) {
                operator_delete(pTVar4,(long)pCVar12[6].twine - (long)pTVar4);
              }
              if (pCVar12 + 2 != &pCVar12->twine->LHS) {
                operator_delete(&pCVar12->twine->LHS,(ulong)((long)&(pCVar12[2].twine)->LHS + 1));
              }
              this = local_238;
            }
            if (pCVar6 != (Child *)0x0) {
              operator_delete(pCVar6,(long)(this->childResults).
                                           super__Vector_base<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                     (long)pCVar6);
            }
            (this->childResults).
            super__Vector_base<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
            ._M_impl.super__Vector_impl_data._M_start = pSVar15;
            (this->childResults).
            super__Vector_base<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish = pSVar11 + 1;
            (this->childResults).
            super__Vector_base<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar15 + uVar20;
          }
          else {
            pCVar5->twine = (Twine *)(pCVar5 + 2);
            if (local_290.twine == (Twine *)&local_280) {
              CVar8._1_7_ = uStack_27f;
              CVar8.character = local_280;
              pCVar5[2] = CVar8;
              pCVar5[3] = CStack_278;
            }
            else {
              pCVar5->twine = (Twine *)local_290;
              CVar7._1_7_ = uStack_27f;
              CVar7.character = local_280;
              pCVar5[2] = CVar7;
            }
            pCVar5[1] = local_288;
            local_288.twine = (Twine *)0x0;
            local_280 = 0;
            pCVar5[4].twine = (Twine *)0x0;
            pCVar5[5].twine = (Twine *)0x0;
            pCVar5[6].twine = (Twine *)0x0;
            local_260 = (Twine *)0x0;
            local_270 = (Twine *)0x0;
            pTStack_268 = (Twine *)0x0;
            pCVar5[10].character = false;
            ppSVar1 = &(local_238->childResults).
                       super__Vector_base<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppSVar1 = *ppSVar1 + 1;
            this = local_238;
            local_290.twine = (Twine *)&local_280;
          }
          uVar17 = local_230;
          if (local_240 == '\x01') {
            if (local_258 != (Twine *)0x0) {
              operator_delete(local_258,(long)local_248 - (long)local_258);
            }
            local_240 = '\0';
          }
          if (local_270 != (Twine *)0x0) {
            operator_delete(local_270,(long)local_260 - (long)local_270);
          }
          if (local_290.twine != (Twine *)&local_280) {
            operator_delete(local_290.twine,CONCAT71(uStack_27f,local_280) + 1);
          }
          str.Length._0_4_ = (undefined4)local_158[0].data.Length;
          str.Data = local_158[0].data.Data;
          str.Length._4_4_ = 0;
          llbuild::buildsystem::BuildKey::BuildKey((BuildKey *)&local_228,'N',str);
          local_290.twine = (Twine *)&local_280;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_290,local_228.twine,(long)&(local_228.twine)->LHS + local_220)
          ;
          uVar17 = uVar17 + 1;
          llbuild::core::TaskInterface::request(&local_1f0,(KeyType *)&local_290,uVar17);
          if (local_290.twine != (Twine *)&local_280) {
            operator_delete(local_290.twine,CONCAT71(uStack_27f,local_280) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228.twine != &local_218) {
            operator_delete(local_228.twine,local_218._M_allocated_capacity + 1);
          }
          if ((uint64_t *)local_158[0].data.Data != &local_158[0].pos) {
            free(local_158[0].data.Data);
          }
        } while (uVar17 != (long)local_200 - (long)local_208 >> 4);
      }
      if (local_208.twine != (Twine *)0x0) {
        operator_delete(local_208.twine,local_1f8 - (long)local_208);
      }
    }
  }
  else {
    pSVar15 = (this->childResults).
              super__Vector_base<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar14 = ((long)(this->childResults).
                    super__Vector_base<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar15 >> 3) *
             0x2e8ba2e8ba2e8ba3;
    if (uVar14 + 1 <= inputID) {
      if (~uVar14 + inputID < uVar14) {
        llvm::optional_detail::
        OptionalStorage<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>::
        operator=(&pSVar15[~uVar14 + inputID].directorySignatureValue.Storage,valueData);
        return;
      }
      __assert_fail("index < childResults.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp"
                    ,0x538,
                    "virtual void (anonymous namespace)::DirectoryTreeSignatureTask::provideValue(TaskInterface, uintptr_t, const KeyType &, const ValueType &)"
                   );
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&pSVar15[inputID - 1].value,valueData);
    local_158[0].data.Data =
         (char *)(valueData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
    local_158[0].data.Length =
         (long)(valueData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_finish - (long)local_158[0].data.Data;
    local_158[0].pos = 0;
    llbuild::buildsystem::BuildValue::BuildValue(&local_1c8,local_158);
    if (local_1c8.kind == ExistingInput) {
      this_00 = llbuild::buildsystem::BuildValue::getOutputInfo(&local_1c8);
      bVar13 = llbuild::basic::FileInfo::isDirectory(this_00);
      if (bVar13) {
        pcVar2 = (this->path)._M_dataplus._M_p;
        local_158[0].data.Data = (char *)&local_158[0].pos;
        local_158[0].data.Length._0_4_ = 0;
        local_158[0].data.Length._4_4_ = 0x100;
        llvm::SmallVectorImpl<char>::append<char_const*,void>
                  ((SmallVectorImpl<char> *)local_158,pcVar2,pcVar2 + (this->path)._M_string_length)
        ;
        llvm::Twine::Twine((Twine *)&local_290,&pSVar15[inputID - 1].filename);
        llvm::Twine::Twine((Twine *)&local_228,"");
        llvm::Twine::Twine((Twine *)&local_208,"");
        llvm::Twine::Twine(&local_1e0,"");
        llvm::sys::path::append
                  ((SmallVectorImpl<char> *)local_158,(Twine *)&local_290,(Twine *)&local_228,
                   (Twine *)&local_208,&local_1e0);
        name.Length._0_4_ = (undefined4)local_158[0].data.Length;
        name.Data = local_158[0].data.Data;
        name.Length._4_4_ = 0;
        llbuild::buildsystem::BuildKey::BuildKey<llbuild::basic::StringList>
                  ((BuildKey *)&local_228,'S',name,&this->filters);
        local_290.twine = (Twine *)&local_280;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_290,local_228.twine,(long)&(local_228.twine)->LHS + local_220);
        llbuild::core::TaskInterface::request
                  (&local_1f0,(KeyType *)&local_290,
                   ((long)(this->childResults).
                          super__Vector_base<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->childResults).
                          super__Vector_base<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3 +
                   inputID);
        if (local_290.twine != (Twine *)&local_280) {
          operator_delete(local_290.twine,CONCAT71(uStack_27f,local_280) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228.twine != &local_218) {
          operator_delete(local_228.twine,local_218._M_allocated_capacity + 1);
        }
        if ((uint64_t *)local_158[0].data.Data != &local_158[0].pos) {
          free(local_158[0].data.Data);
        }
      }
    }
  }
  llbuild::buildsystem::BuildValue::~BuildValue(&local_1c8);
  return;
}

Assistant:

virtual void provideValue(TaskInterface ti, uintptr_t inputID,
                            const KeyType& key, const ValueType& valueData) override {
    // The first input is the directory contents.
    if (inputID == 0) {
      // Record the value for the directory.
      directoryValue = valueData;

      // Request the inputs for each subpath.
      auto value = BuildValue::fromData(valueData);
      if ((filters.isEmpty() && !value.isDirectoryContents()) ||
          (!filters.isEmpty() && !value.isFilteredDirectoryContents())) {
        return;
      }

      assert(value.isFilteredDirectoryContents() || value.isDirectoryContents());
      auto filenames = value.getDirectoryContents();
      for (size_t i = 0; i != filenames.size(); ++i) {
        SmallString<256> childPath{ path };
        llvm::sys::path::append(childPath, filenames[i]);
        childResults.emplace_back(SubpathInfo{ filenames[i], {}, None });
        ti.request(BuildKey::makeNode(childPath).toData(), /*inputID=*/1 + i);
      }
      return;
    }

    // If the input is a child, add it to the collection and dispatch a
    // directory request if needed.
    if (inputID >= 1 && inputID < 1 + childResults.size()) {
      auto index = inputID - 1;
      auto& childResult = childResults[index];
      childResult.value = valueData;

      // If this node is a directory, request its signature recursively.
      auto value = BuildValue::fromData(valueData);
      if (value.isExistingInput()) {
        if (value.getOutputInfo().isDirectory()) {
          SmallString<256> childPath{ path };
          llvm::sys::path::append(childPath, childResult.filename);

          ti.request(BuildKey::makeDirectoryTreeSignature(childPath,
                                                          filters).toData(),
                     /*inputID=*/1 + childResults.size() + index);
        }
      }
      return;
    }

    // Otherwise, the input should be a directory signature.
    auto index = inputID - 1 - childResults.size();
    assert(index < childResults.size());
    childResults[index].directorySignatureValue = valueData;
  }